

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O2

uint16_t modifier_mask_from_keysym
                   (xcb_key_symbols_t *symbols,xcb_keycode_t *modifiers,uint8_t modifier_count,
                   uint8_t keycodes_per_modifier,xcb_keysym_t keysym)

{
  xcb_keycode_t xVar1;
  xcb_keycode_t *__ptr;
  ulong uVar2;
  xcb_keycode_t *pxVar3;
  ulong uVar4;
  
  __ptr = (xcb_keycode_t *)xcb_key_symbols_get_keycode(symbols,keysym);
  if (__ptr != (xcb_keycode_t *)0x0) {
    for (uVar4 = 0; uVar4 != modifier_count; uVar4 = uVar4 + 1) {
      for (uVar2 = 0; uVar2 != keycodes_per_modifier; uVar2 = uVar2 + 1) {
        pxVar3 = __ptr;
        if (modifiers[uVar2 + uVar4 * keycodes_per_modifier] != '\0') {
          while (xVar1 = *pxVar3, xVar1 != '\0') {
            pxVar3 = pxVar3 + 1;
            if (xVar1 == modifiers[uVar2 + uVar4 * keycodes_per_modifier]) {
              free(__ptr);
              return (uint16_t)(1 << ((uint)uVar4 & 0x1f));
            }
          }
        }
      }
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

static uint16_t modifier_mask_from_keysym(xcb_key_symbols_t *symbols,
                                          const xcb_keycode_t *modifiers, uint8_t modifier_count,
                                          uint8_t keycodes_per_modifier, xcb_keysym_t keysym)
{
        xcb_keycode_t *keycodes = xcb_key_symbols_get_keycode(symbols, keysym);

        if (keycodes == NULL) {
                return 0;
        }

        for (uint8_t i = 0; i < modifier_count; ++i) {
                for (uint8_t j = 0; j < keycodes_per_modifier; ++j) {
                        xcb_keycode_t modifier = modifiers[i * keycodes_per_modifier + j];

                        if (modifier == XCB_NONE) {
                                continue;
                        }

                        for (xcb_keycode_t *key = keycodes; *key != XCB_NONE; key++) {
                                if (*key == modifier) {
                                        free(keycodes);

                                        return (uint16_t)(1 << i);
                                }
                        }
                }
        }

        free(keycodes);

        return 0;
}